

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

Node * ParseXMLElement(TidyDocImpl *doc,Node *element,GetTokenMode mode)

{
  Lexer *pLVar1;
  TidyParserMemory data;
  int iVar2;
  Bool BVar3;
  Node *pNVar4;
  code *pcStack_98;
  TidyParserMemory memory_1;
  TidyParserMemory memory;
  Node *node;
  Lexer *lexer;
  Node *pNStack_20;
  GetTokenMode mode_local;
  Node *element_local;
  TidyDocImpl *doc_local;
  
  pLVar1 = doc->lexer;
  if (element == (Node *)0x0) {
    prvTidypopMemory((TidyParserMemory *)&memory_1.register_2,doc);
    pNStack_20 = (Node *)memory.identity;
    lexer._4_4_ = (GetTokenMode)memory.reentry_node;
    prvTidyInsertNodeAtEnd((Node *)memory.identity,memory.original_node);
  }
  else {
    BVar3 = prvTidyXMLPreserveWhiteSpace(doc,element);
    lexer._4_4_ = mode;
    if (BVar3 != no) {
      lexer._4_4_ = Preformatted;
    }
    InsertMisc(&doc->root,element);
    BVar3 = prvTidynodeIsText(element);
    pNStack_20 = element;
    if (BVar3 != no) {
      prvTidyReport(doc,&doc->root,element,0x235);
      prvTidyFreeNode(doc,element);
      return (Node *)0x0;
    }
  }
  do {
    pNVar4 = prvTidyGetToken(doc,lexer._4_4_);
    if (pNVar4 == (Node *)0x0) {
LAB_00148814:
      pNVar4 = pNStack_20->content;
      BVar3 = prvTidynodeIsText(pNVar4);
      if (((BVar3 != no) && (lexer._4_4_ != Preformatted)) &&
         ((pLVar1->lexbuf[pNVar4->start] == ' ' &&
          (pNVar4->start = pNVar4->start + 1, pNVar4->end <= pNVar4->start)))) {
        prvTidyDiscardElement(doc,pNVar4);
      }
      pNVar4 = pNStack_20->last;
      BVar3 = prvTidynodeIsText(pNVar4);
      if (((BVar3 != no) && (lexer._4_4_ != Preformatted)) &&
         ((pLVar1->lexbuf[pNVar4->end - 1] == ' ' &&
          (pNVar4->end = pNVar4->end - 1, pNVar4->end <= pNVar4->start)))) {
        prvTidyDiscardElement(doc,pNVar4);
      }
      return (Node *)0x0;
    }
    if ((((pNVar4->type == EndTag) && (pNVar4->element != (tmbstr)0x0)) &&
        (pNStack_20->element != (tmbstr)0x0)) &&
       (iVar2 = prvTidytmbstrcmp(pNVar4->element,pNStack_20->element), iVar2 == 0)) {
      prvTidyFreeNode(doc,pNVar4);
      pNStack_20->closed = yes;
      goto LAB_00148814;
    }
    if (pNVar4->type == EndTag) {
      if (pNStack_20 == (Node *)0x0) {
        prvTidyReport(doc,(Node *)0x0,pNVar4,0x285);
      }
      else {
        prvTidyReport(doc,pNStack_20,pNVar4,0x286);
      }
      prvTidyFreeNode(doc,pNVar4);
    }
    else {
      if (pNVar4->type == StartTag) {
        memset(&pcStack_98,0,0x30);
        pcStack_98 = ParseXMLElement;
        memory_1.identity = (Parser *)pNStack_20;
        memory_1.reentry_node._0_4_ = lexer._4_4_;
        data.reentry_state = memory_1.reentry_node._4_4_;
        data.reentry_mode = lexer._4_4_;
        data.original_node = pNStack_20;
        data.identity = ParseXMLElement;
        data.reentry_node = pNVar4;
        data.mode = memory_1.reentry_mode;
        data.register_1 = memory_1.reentry_state;
        data.register_2 = memory_1.mode;
        data._44_4_ = memory_1.register_1;
        memory_1.original_node = pNVar4;
        prvTidypushMemory(doc,data);
        return pNVar4;
      }
      prvTidyInsertNodeAtEnd(pNStack_20,pNVar4);
    }
  } while( true );
}

Assistant:

static Node* ParseXMLElement(TidyDocImpl* doc, Node *element, GetTokenMode mode)
{
    Lexer* lexer = doc->lexer;
    Node *node;

    if ( element == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        element = memory.original_node;
        node = memory.reentry_node; /* Throwaway, as main loop overrwrites anyway. */
        mode = memory.reentry_mode;
        TY_(InsertNodeAtEnd)(element, node); /* The only re-entry action needed. */
    }
    else
    {
        /* if node is pre or has xml:space="preserve" then do so */
        if ( TY_(XMLPreserveWhiteSpace)(doc, element) )
            mode = Preformatted;

        /* deal with comments etc. */
        InsertMisc( &doc->root, element);
        
        /* we shouldn't have plain text at this point. */
        if (TY_(nodeIsText)(element))
        {
            TY_(Report)(doc, &doc->root, element, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, element);
            return NULL;
        }
    }
    while ((node = TY_(GetToken)(doc, mode)) != NULL)
    {
        if (node->type == EndTag &&
           node->element && element->element &&
           TY_(tmbstrcmp)(node->element, element->element) == 0)
        {
            TY_(FreeNode)( doc, node);
            element->closed = yes;
            break;
        }

        /* discard unexpected end tags */
        if (node->type == EndTag)
        {
            if (element)
                TY_(Report)(doc, element, node, UNEXPECTED_ENDTAG_IN);
            else
                TY_(Report)(doc, element, node, UNEXPECTED_ENDTAG_ERR);

            TY_(FreeNode)( doc, node);
            continue;
        }

        /* parse content on seeing start tag */
        if (node->type == StartTag)
        {
            TidyParserMemory memory = {0};
            memory.identity = ParseXMLElement;
            memory.original_node = element;
            memory.reentry_node = node;
            memory.reentry_mode = mode;
            TY_(pushMemory)( doc, memory );
            return node;
        }

        TY_(InsertNodeAtEnd)(element, node);
    } /* while */

    /*
     if first child is text then trim initial space and
     delete text node if it is empty.
    */

    node = element->content;

    if (TY_(nodeIsText)(node) && mode != Preformatted)
    {
        if ( lexer->lexbuf[node->start] == ' ' )
        {
            node->start++;

            if (node->start >= node->end)
                TY_(DiscardElement)( doc, node );
        }
    }

    /*
     if last child is text then trim final space and
     delete the text node if it is empty
    */

    node = element->last;

    if (TY_(nodeIsText)(node) && mode != Preformatted)
    {
        if ( lexer->lexbuf[node->end - 1] == ' ' )
        {
            node->end--;

            if (node->start >= node->end)
                TY_(DiscardElement)( doc, node );
        }
    }
    return NULL;
}